

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O0

double despot::POMCP::Rollout
                 (State *particle,RandomStreams *streams,int depth,DSPOMDP *model,POMCPPrior *prior)

{
  POMCPPrior *pPVar1;
  RandomStreams *pRVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  log_ostream *plVar6;
  ostream *poVar7;
  void *this;
  double dVar8;
  double dVar9;
  undefined8 uStack_50;
  bool terminal;
  OBS_TYPE obs;
  double reward;
  POMCPPrior *pPStack_38;
  ACT_TYPE action;
  POMCPPrior *prior_local;
  DSPOMDP *model_local;
  RandomStreams *pRStack_20;
  int depth_local;
  RandomStreams *streams_local;
  State *particle_local;
  
  pPStack_38 = prior;
  prior_local = (POMCPPrior *)model;
  model_local._4_4_ = depth;
  pRStack_20 = streams;
  streams_local = (RandomStreams *)particle;
  bVar3 = RandomStreams::Exhausted(streams);
  if (bVar3) {
    particle_local = (State *)0x0;
  }
  else {
    reward._4_4_ = POMCPPrior::GetAction(pPStack_38,(State *)streams_local);
    iVar4 = logging::level();
    if ((0 < iVar4) && (iVar4 = logging::level(), 3 < iVar4)) {
      plVar6 = logging::stream(4);
      poVar7 = despot::operator<<(&plVar6->super_ostream,(State *)streams_local);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    iVar4 = logging::level();
    if ((0 < iVar4) && (iVar4 = logging::level(), 3 < iVar4)) {
      plVar6 = logging::stream(4);
      poVar7 = std::operator<<(&plVar6->super_ostream,"depth = ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,model_local._4_4_);
      poVar7 = std::operator<<(poVar7,"; action = ");
      this = (void *)std::ostream::operator<<(poVar7,reward._4_4_);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    pRVar2 = streams_local;
    pPVar1 = prior_local;
    RandomStreams::Entry
              (pRStack_20,
               *(int *)&(streams_local->streams_).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    uVar5 = (*pPVar1->_vptr_POMCPPrior[2])
                      (pPVar1,pRVar2,(ulong)reward._4_4_,&obs,&stack0xffffffffffffffb0);
    if ((uVar5 & 1) == 0) {
      (*pPStack_38->_vptr_POMCPPrior[6])(pPStack_38,(ulong)reward._4_4_,uStack_50);
      RandomStreams::Advance(pRStack_20);
      dVar8 = Globals::Discount();
      dVar9 = Rollout((State *)streams_local,pRStack_20,model_local._4_4_ + 1,(DSPOMDP *)prior_local
                      ,pPStack_38);
      obs = (OBS_TYPE)(dVar8 * dVar9 + (double)obs);
      RandomStreams::Back(pRStack_20);
      (*pPStack_38->_vptr_POMCPPrior[7])();
    }
    particle_local = (State *)obs;
  }
  return (double)particle_local;
}

Assistant:

double POMCP::Rollout(State* particle, RandomStreams& streams, int depth,
	const DSPOMDP* model, POMCPPrior* prior) {
	if (streams.Exhausted()) {
		return 0;
	}

	ACT_TYPE action = prior->GetAction(*particle);

	logd << *particle << endl;
	logd << "depth = " << depth << "; action = " << action << endl;

	double reward;
	OBS_TYPE obs;
	bool terminal = model->Step(*particle, streams.Entry(particle->scenario_id),
		action, reward, obs);
	if (!terminal) {
		prior->Add(action, obs);
		streams.Advance();
		reward += Globals::Discount()
			* Rollout(particle, streams, depth + 1, model, prior);
		streams.Back();
		prior->PopLast();
	}

	return reward;
}